

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

string * __thiscall
ArrayType::surroundName(string *__return_storage_ptr__,ArrayType *this,string *name)

{
  uint i;
  uint uVar1;
  string *this_00;
  string ret;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  if ((this->isPointerArray == true) && (this->pointer->isArrayPointer == true)) {
    std::__cxx11::string::assign((char *)&local_b0);
    for (uVar1 = 0; uVar1 < this->pointer->levels; uVar1 = uVar1 + 1) {
      std::__cxx11::string::append((char *)&local_b0);
    }
    std::operator+(&local_70,&local_b0,name);
    sizeToString_abi_cxx11_(&local_90,this);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_d0,&local_50,")");
    std::operator+(__return_storage_ptr__,&local_d0,&this->pointer->sizes);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_70;
  }
  else {
    sizeToString_abi_cxx11_(&local_d0,this);
    std::operator+(__return_storage_ptr__,name,&local_d0);
    this_00 = &local_d0;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayType::surroundName(const std::string& name) {
    std::string ret;
    if (isPointerArray && pointer->isArrayPointer) {
        ret = "(";
        for (unsigned i = 0; i < pointer->levels; i++) {
            ret += "*";
        }
        return ret + name + sizeToString() + ")" + pointer->sizes;
    } else {
        return name + sizeToString();
    }
}